

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_property_reader.h
# Opt level: O2

void __thiscall
draco::PlyPropertyReader<int>::PlyPropertyReader(PlyPropertyReader<int> *this,PlyProperty *property)

{
  function<int_(int)> *this_00;
  anon_class_8_1_8991fb9c local_8;
  
  this->property_ = property;
  *(undefined8 *)&(this->convert_value_func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->convert_value_func_).super__Function_base._M_functor + 8) = 0;
  (this->convert_value_func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->convert_value_func_)._M_invoker = (_Invoker_type)0x0;
  if (property->data_type_ - DT_INT8 < 10) {
    this_00 = &this->convert_value_func_;
    local_8.this = this;
    switch(property->data_type_) {
    case DT_INT8:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_UINT8:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_INT16:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_UINT16:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_INT32:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_UINT32:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_FLOAT32:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
      break;
    case DT_FLOAT64:
      std::function<int(int)>::operator=((function<int(int)> *)this_00,&local_8);
    }
  }
  return;
}

Assistant:

explicit PlyPropertyReader(const PlyProperty *property)
      : property_(property) {
    // Find the suitable function for converting values.
    switch (property->data_type()) {
      case DT_UINT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint8_t>(val_id);
        };
        break;
      case DT_INT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int8_t>(val_id);
        };
        break;
      case DT_UINT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint16_t>(val_id);
        };
        break;
      case DT_INT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int16_t>(val_id);
        };
        break;
      case DT_UINT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint32_t>(val_id);
        };
        break;
      case DT_INT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int32_t>(val_id);
        };
        break;
      case DT_FLOAT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<float>(val_id);
        };
        break;
      case DT_FLOAT64:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<double>(val_id);
        };
        break;
      default:
        break;
    }
  }